

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deSpinBarrier.cpp
# Opt level: O2

void de::anon_unknown_0::multiThreadRemoveTest(int numThreads,WaitMode waitMode)

{
  pointer ppTVar1;
  TestExitThread *this;
  long lVar2;
  ulong uVar3;
  int ndx;
  ulong uVar4;
  vector<de::(anonymous_namespace)::TestExitThread_*,_std::allocator<de::(anonymous_namespace)::TestExitThread_*>_>
  local_60;
  SpinBarrier barrier;
  
  SpinBarrier::SpinBarrier(&barrier,numThreads);
  uVar3 = (ulong)(uint)numThreads * 8;
  ppTVar1 = (pointer)operator_new(uVar3);
  local_60.
  super__Vector_base<de::(anonymous_namespace)::TestExitThread_*,_std::allocator<de::(anonymous_namespace)::TestExitThread_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = ppTVar1 + (uint)numThreads;
  local_60.
  super__Vector_base<de::(anonymous_namespace)::TestExitThread_*,_std::allocator<de::(anonymous_namespace)::TestExitThread_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = ppTVar1;
  if (numThreads != 0) {
    for (lVar2 = 0;
        local_60.
        super__Vector_base<de::(anonymous_namespace)::TestExitThread_*,_std::allocator<de::(anonymous_namespace)::TestExitThread_*>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_60.
             super__Vector_base<de::(anonymous_namespace)::TestExitThread_*,_std::allocator<de::(anonymous_namespace)::TestExitThread_*>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage, uVar3 - lVar2 != 0;
        lVar2 = lVar2 + 8) {
      *(undefined8 *)((long)ppTVar1 + lVar2) = 0;
    }
  }
  uVar3 = 0;
  uVar4 = 0;
  local_60.
  super__Vector_base<de::(anonymous_namespace)::TestExitThread_*,_std::allocator<de::(anonymous_namespace)::TestExitThread_*>_>
  ._M_impl.super__Vector_impl_data._M_start = ppTVar1;
  if (0 < numThreads) {
    uVar4 = (ulong)(uint)numThreads;
  }
  for (; uVar4 != uVar3; uVar3 = uVar3 + 1) {
    this = (TestExitThread *)operator_new(0x30);
    Thread::Thread((Thread *)this);
    (this->super_Thread)._vptr_Thread = (_func_int **)&PTR__Thread_002830c0;
    this->m_barrier = &barrier;
    this->m_numThreads = numThreads;
    this->m_threadNdx = (int)uVar3;
    this->m_waitMode = waitMode;
    ppTVar1[uVar3] = this;
    Thread::start((Thread *)this);
  }
  for (uVar3 = 0; uVar4 != uVar3; uVar3 = uVar3 + 1) {
    Thread::join(&ppTVar1[uVar3]->super_Thread);
    if (ppTVar1[uVar3] != (TestExitThread *)0x0) {
      (*(ppTVar1[uVar3]->super_Thread)._vptr_Thread[1])();
    }
  }
  std::
  vector<de::(anonymous_namespace)::TestExitThread_*,_std::allocator<de::(anonymous_namespace)::TestExitThread_*>_>
  ::~vector(&local_60);
  return;
}

Assistant:

void multiThreadRemoveTest (int numThreads, SpinBarrier::WaitMode waitMode)
{
	SpinBarrier						barrier		(numThreads);
	std::vector<TestExitThread*>	threads		(numThreads, static_cast<TestExitThread*>(DE_NULL));

	for (int ndx = 0; ndx < numThreads; ndx++)
	{
		threads[ndx] = new TestExitThread(barrier, numThreads, ndx, waitMode);
		DE_TEST_ASSERT(threads[ndx]);
		threads[ndx]->start();
	}

	for (int ndx = 0; ndx < numThreads; ndx++)
	{
		threads[ndx]->join();
		delete threads[ndx];
	}
}